

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

wchar_t * ma_copy_string_w(wchar_t *src,ma_allocation_callbacks *pAllocationCallbacks)

{
  size_t __size;
  size_t sVar1;
  wchar_t *dst;
  
  sVar1 = wcslen(src);
  __size = sVar1 * 4 + 4;
  if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
    dst = (wchar_t *)malloc(__size);
  }
  else {
    if (pAllocationCallbacks->onMalloc == (_func_void_ptr_size_t_void_ptr *)0x0) {
      return (wchar_t *)0x0;
    }
    dst = (wchar_t *)(*pAllocationCallbacks->onMalloc)(__size,pAllocationCallbacks->pUserData);
  }
  if (dst == (wchar_t *)0x0) {
    return (wchar_t *)0x0;
  }
  ma_wcscpy_s(dst,sVar1 + 1,src);
  return dst;
}

Assistant:

MA_API MA_NO_INLINE wchar_t* ma_copy_string_w(const wchar_t* src, const ma_allocation_callbacks* pAllocationCallbacks)
{
    size_t sz = wcslen(src)+1;
    wchar_t* dst = (wchar_t*)ma_malloc(sz * sizeof(*dst), pAllocationCallbacks);
    if (dst == NULL) {
        return NULL;
    }

    ma_wcscpy_s(dst, sz, src);

    return dst;
}